

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.cpp
# Opt level: O1

ssize_t __thiscall bucket::read(bucket *this,int __fd,void *__buf,size_t __nbytes)

{
  uint8_t *puVar1;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  void *extraout_RDX_01;
  undefined4 in_register_00000034;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  allocator_type local_41;
  vector<index,_std::allocator<index>_> local_40;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  std::istream::seekg(pcVar3,0,0);
  std::istream::read(pcVar3,(long)this);
  puVar1 = &this->size;
  std::istream::read(pcVar3,(long)puVar1);
  std::istream::read(pcVar3,(long)&this->depth);
  std::vector<index,_std::allocator<index>_>::vector(&local_40,(ulong)this->size,&local_41);
  std::vector<index,_std::allocator<index>_>::_M_move_assign(&this->indices,&local_40);
  uVar2 = extraout_RAX;
  __buf_00 = extraout_RDX;
  if (local_40.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar2 = extraout_RAX_00;
    __buf_00 = extraout_RDX_00;
  }
  if (*puVar1 != '\0') {
    lVar4 = 0;
    uVar5 = 0;
    do {
      index::read((index *)((long)&((this->indices).
                                    super__Vector_base<index,_std::allocator<index>_>._M_impl.
                                    super__Vector_impl_data._M_start)->file_id + lVar4),__fd,
                  __buf_00,__nbytes);
      uVar5 = uVar5 + 1;
      uVar2 = (ulong)*puVar1;
      lVar4 = lVar4 + 0xc;
      __buf_00 = extraout_RDX_01;
    } while (uVar5 < uVar2);
  }
  return uVar2;
}

Assistant:

void bucket::read(std::fstream &stream) {
    stream.seekg(0);

    stream.read((char *) &id, BUCKET_ID);
    stream.read((char *) &size, BUCKET_SIZE_FIELD);
    stream.read((char *) &depth, DEPTHS);

    indices = std::vector<index>(size);

    for (int i = 0; i < size; ++i) {
        indices[i].read(stream);
    }
}